

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::ReadFilesInDirectory(string *path)

{
  FILE *__stream;
  char *pcVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool local_c1;
  undefined4 local_b0;
  uint local_ac;
  int summarySet;
  int summaryCalcStreamType;
  FILE *fin;
  byte local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [55];
  allocator local_41;
  string local_40 [8];
  string s;
  dirent *ent;
  DIR *dir;
  string *path_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar1);
  if (__dirp != (DIR *)0x0) {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pdVar2->d_name,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      uVar3 = std::__cxx11::string::length();
      local_79 = 0;
      local_c1 = false;
      if (4 < uVar3) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_78,(ulong)local_40);
        local_79 = 1;
        local_c1 = std::operator==(local_78,".bin");
      }
      if ((local_79 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_78);
      }
      if (local_c1 != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                       (char *)path);
        std::__cxx11::string::operator=(local_40,(string *)&fin);
        std::__cxx11::string::~string((string *)&fin);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        _summarySet = fopen(pcVar1,"rb");
        __stream = _stderr;
        if (_summarySet == (FILE *)0x0) {
          uVar4 = std::__cxx11::string::c_str();
          fprintf(__stream,"FATAL: %s: cannot open %s\n","ReadFilesInDirectory",uVar4);
          exit(1);
        }
        local_ac = 0;
        fread(&local_ac,4,1,_summarySet);
        if (local_ac != 0x3000001) {
          fprintf(_stderr,"FATAL: %s: invalid stream type %d\n","ReadFilesInDirectory",
                  (ulong)local_ac);
          exit(1);
        }
        fread(&sampleSize_,4,1,_summarySet);
        local_b0 = 0;
        fread(&local_b0,4,1,_summarySet);
        ReadInputStream((FILE *)_summarySet);
        fclose(_summarySet);
      }
      std::__cxx11::string::~string(local_40);
    }
  }
  return;
}

Assistant:

void ReadFilesInDirectory(const std::string& path) {

    DIR *dir = nullptr;
    struct dirent *ent = nullptr;
    if ((dir = opendir(path.c_str())) != nullptr) {
      while ((ent = readdir(dir)) != nullptr) {
        std::string s = ent->d_name;
	if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
	  s = path + ent->d_name;
	  FILE *fin = fopen(s.c_str(), "rb");
	  if (fin == nullptr) {
	    fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, s.c_str());
	    exit(EXIT_FAILURE);
	  }
	  int summaryCalcStreamType = 0;
	  fread(&summaryCalcStreamType, sizeof(summaryCalcStreamType), 1, fin);
	  if (summaryCalcStreamType != (summarycalc_id | 1)) {
	    fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__,
		    summaryCalcStreamType);
	    exit(EXIT_FAILURE);
	  }
	  fread(&sampleSize_, sizeof(sampleSize_), 1, fin);
	  int summarySet = 0;
	  fread(&summarySet, sizeof(summarySet), 1, fin);

	  ReadInputStream(fin);

	  fclose(fin);

	}

      }

    }

  }